

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirINCLUDE(void)

{
  fullpath_ref_t nfilename;
  ulong uVar1;
  fullpath_ref_t fnaam;
  
  nfilename = GetInputFile(&lp);
  uVar1 = std::filesystem::__cxx11::path::has_filename();
  if ((uVar1 & 1) == 0) {
    Error("[INCLUDE] empty filename",bp,PASS3);
  }
  else {
    ListFile(false);
    IncludeFile(nfilename);
    donotlist = 1;
  }
  return;
}

Assistant:

static void dirINCLUDE() {
	fullpath_ref_t fnaam = GetInputFile(lp);
	if (fnaam.full.has_filename()) {
		ListFile();
		IncludeFile(fnaam);
		donotlist = 1;
	} else {
		Error("[INCLUDE] empty filename", bp);
	}
}